

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphContigger.cc
# Opt level: O2

bool __thiscall
GraphContigger::solve_tip(GraphContigger *this,TangleView *t,Strider *s,GraphEditor *ge)

{
  pointer pNVar1;
  pointer plVar2;
  pointer plVar3;
  bool bVar4;
  _Vector_base<long,_std::allocator<long>_> local_88;
  vector<long,_std::allocator<long>_> f1s;
  SequenceDistanceGraphPath local_58;
  
  Strider::stride_out_in_order
            (&local_58,s,
             -((t->frontiers).super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
               super__Vector_impl_data._M_start)->id,true,true,false);
  local_88._M_impl.super__Vector_impl_data._M_start =
       local_58.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_88._M_impl.super__Vector_impl_data._M_finish =
       local_58.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_58.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&local_58);
  Strider::stride_out_in_order
            (&local_58,s,
             -(t->frontiers).super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
              super__Vector_impl_data._M_start[1].id,true,true,false);
  plVar3 = local_58.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  plVar2 = local_58.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  f1s.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       local_58.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_start;
  f1s.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       local_58.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  f1s.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_58.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_58.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&local_58);
  if (8 < (ulong)((long)local_88._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_88._M_impl.super__Vector_impl_data._M_start)) {
    pNVar1 = (t->frontiers).super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar4 = false;
    if ((local_88._M_impl.super__Vector_impl_data._M_start[1] != pNVar1[1].id) ||
       (bVar4 = false, (ulong)((long)plVar3 - (long)plVar2) < 9)) goto LAB_0021e8a9;
    if (plVar2[1] == pNVar1->id) {
      bVar4 = GraphEditor::queue_node_deletion
                        (ge,((t->internals).super__Vector_base<NodeView,_std::allocator<NodeView>_>.
                             _M_impl.super__Vector_impl_data._M_start)->id);
      goto LAB_0021e8a9;
    }
  }
  bVar4 = false;
LAB_0021e8a9:
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&f1s.super__Vector_base<long,_std::allocator<long>_>);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_88);
  return bVar4;
}

Assistant:

bool GraphContigger::solve_tip(TangleView &t, Strider &s, GraphEditor &ge){
    //just check that each frontier connects to the other one through reads
    auto f0s = s.stride_out_in_order(-t.frontiers[0].node_id()).nodes;
    auto f1s = s.stride_out_in_order(-t.frontiers[1].node_id()).nodes;
    if (f0s.size()>1 and f0s[1]==t.frontiers[1].node_id() and f1s.size()>1 and f1s[1]==t.frontiers[0].node_id()){
        return ge.queue_node_deletion(t.internals[0].node_id());
    }
    return false;
}